

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLMcode cpool_update_shutdown_ev(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  CURLMcode CVar1;
  easy_pollset ps;
  easy_pollset local_48;
  
  local_48.sockets[4] = 0;
  local_48.num = 0;
  local_48.actions[0] = '\0';
  local_48.actions[1] = '\0';
  local_48.actions[2] = '\0';
  local_48.actions[3] = '\0';
  local_48.actions[4] = '\0';
  local_48._29_3_ = 0;
  local_48.sockets[0] = 0;
  local_48.sockets[1] = 0;
  local_48.sockets[2] = 0;
  local_48.sockets[3] = 0;
  Curl_attach_connection(data,conn);
  Curl_conn_adjust_pollset(data,&local_48);
  Curl_detach_connection(data);
  CVar1 = Curl_multi_pollset_ev(multi,data,&local_48,&conn->shutdown_poll);
  if (CVar1 == CURLM_OK) {
    *(undefined8 *)((conn->shutdown_poll).sockets + 4) = local_48._16_8_;
    (conn->shutdown_poll).actions[0] = local_48.actions[0];
    (conn->shutdown_poll).actions[1] = local_48.actions[1];
    (conn->shutdown_poll).actions[2] = local_48.actions[2];
    (conn->shutdown_poll).actions[3] = local_48.actions[3];
    (conn->shutdown_poll).actions[4] = local_48.actions[4];
    *(undefined3 *)&(conn->shutdown_poll).field_0x1d = local_48._29_3_;
    *(undefined8 *)(conn->shutdown_poll).sockets = local_48.sockets._0_8_;
    *(undefined8 *)((conn->shutdown_poll).sockets + 2) = local_48.sockets._8_8_;
  }
  return CVar1;
}

Assistant:

static CURLMcode cpool_update_shutdown_ev(struct Curl_multi *multi,
                                          struct Curl_easy *data,
                                          struct connectdata *conn)
{
  struct easy_pollset ps;
  CURLMcode mresult;

  DEBUGASSERT(data);
  DEBUGASSERT(multi);
  DEBUGASSERT(multi->socket_cb);

  memset(&ps, 0, sizeof(ps));
  Curl_attach_connection(data, conn);
  Curl_conn_adjust_pollset(data, &ps);
  Curl_detach_connection(data);

  mresult = Curl_multi_pollset_ev(multi, data, &ps, &conn->shutdown_poll);

  if(!mresult) /* Remember for next time */
    memcpy(&conn->shutdown_poll, &ps, sizeof(ps));
  return mresult;
}